

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compute_num_ai_workers(AV1_COMP *cpi)

{
  int local_20;
  int num_mb_rows;
  int mb_step;
  BLOCK_SIZE bsize;
  AV1_COMP *cpi_local;
  int local_4;
  
  if ((cpi->oxcf).max_threads < 2) {
    local_4 = 1;
  }
  else if (((cpi->oxcf).row_mt & 1U) == 0) {
    local_4 = 1;
  }
  else {
    cpi->weber_bsize = BLOCK_8X8;
    local_20 = (cpi->common).mi_params.mi_rows /
               (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [cpi->weber_bsize];
    if ((cpi->oxcf).max_threads <= local_20) {
      local_20 = (cpi->oxcf).max_threads;
    }
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

static inline int compute_num_ai_workers(AV1_COMP *cpi) {
  if (cpi->oxcf.max_threads <= 1) return 1;
  // The multi-threading implementation of deltaq-mode = 3 in allintra
  // mode is based on row multi threading.
  if (!cpi->oxcf.row_mt) return 1;
  cpi->weber_bsize = BLOCK_8X8;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const int mb_step = mi_size_wide[bsize];
  const int num_mb_rows = cpi->common.mi_params.mi_rows / mb_step;
  return AOMMIN(num_mb_rows, cpi->oxcf.max_threads);
}